

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O2

int webrtc::WebRtcAec_InitAec(AecCore *aec,int sampFreq)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  
  aec->sampFreq = sampFreq;
  SetAdaptiveFilterStepSize(aec);
  SetErrorThreshold(aec);
  if (sampFreq == 8000) {
    sVar3 = 1;
  }
  else {
    sVar3 = (size_t)(sampFreq / 16000);
  }
  aec->num_bands = sVar3;
  WebRtc_InitBuffer(aec->nearFrBuf);
  WebRtc_InitBuffer(aec->outFrBuf);
  for (lVar4 = 5; lVar4 != 7; lVar4 = lVar4 + 1) {
    WebRtc_InitBuffer(aec->nearFrBufH[lVar4 + -5]);
    WebRtc_InitBuffer(aec->nearFrBufH[lVar4 + -3]);
  }
  WebRtc_InitBuffer(aec->far_time_buf);
  aec->system_delay = 0;
  iVar1 = WebRtc_InitDelayEstimatorFarend(aec->delay_estimator_farend);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = WebRtc_InitDelayEstimator(aec->delay_estimator);
    if (iVar1 == 0) {
      aec->delay_logging_enabled = 0;
      memset(&aec->delay_metrics_delivered,0,0x1fc);
      aec->delay_median = -1;
      aec->delay_std = -1;
      aec->fraction_poor_delays = -1.0;
      aec->signal_delay_correction = 0;
      aec->previous_delay = -2;
      aec->delay_correction_count = 0;
      aec->shift_offset = 5;
      aec->delay_quality_threshold = 0.01;
      aec->num_partitions = 0xc;
      WebRtc_set_allowed_offset(aec->delay_estimator,6);
      WebRtc_enable_robust_validation(aec->delay_estimator,1);
      aec->frame_count = 0;
      aec->nlp_mode = 1;
      if (aec->num_bands < 2) {
        iVar2 = (int)(short)((short)aec->sampFreq / 8000);
      }
      else {
        iVar2 = 2;
      }
      aec->mult = iVar2;
      memset(aec->dInitMinPow,0,0x104);
      aec->farBufWritePos = 0;
      aec->farBufReadPos = 0;
      aec->knownDelay = 0;
      aec->inSamples = 0;
      aec->outSamples = 0;
      memset(aec->dBuf,0,0xa08);
      aec->noisePow = aec->dInitMinPow;
      aec->noiseEstCtr = 0;
      for (lVar4 = 0x294; lVar4 != 0x2d5; lVar4 = lVar4 + 1) {
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x28) = 0x49742400;
      }
      aec->xfBufBlockPos = 0;
      memset(aec->se,0,0x104);
      memset(aec->xfBuf,0,0xc710);
      for (lVar4 = 0x351d; lVar4 != 0x355e; lVar4 = lVar4 + 1) {
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x28) = 0x3f800000;
      }
      for (lVar4 = 0x34dc; lVar4 != 0x351d; lVar4 = lVar4 + 1) {
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x28) = 0x3f800000;
      }
      iVar2 = 0;
      memset(aec->hNs,0,0x104);
      memset(aec->outBuf,0,0x100);
      aec->hNlFbMin = 1.0;
      aec->hNlFbLocalMin = 1.0;
      aec->hNlXdAvgMin = 1.0;
      aec->hNlNewMin = 0;
      aec->hNlMinCtr = 0;
      aec->overDrive = 2.0;
      aec->overDriveSm = 2.0;
      aec->delayIdx = 0;
      aec->stNearState = 0;
      aec->echoState = 0;
      aec->divergeState = 0;
      aec->seed = 0x309;
      aec->delayEstCtr = 0;
      aec->extreme_filter_divergence = 0;
      aec->metricsMode = 0;
      InitMetrics(aec);
    }
  }
  return iVar2;
}

Assistant:

int WebRtcAec_InitAec(AecCore* aec, int sampFreq) {
  int i;

  aec->sampFreq = sampFreq;

  SetAdaptiveFilterStepSize(aec);
  SetErrorThreshold(aec);

  if (sampFreq == 8000) {
    aec->num_bands = 1;
  } else {
    aec->num_bands = (size_t)(sampFreq / 16000);
  }

  WebRtc_InitBuffer(aec->nearFrBuf);
  WebRtc_InitBuffer(aec->outFrBuf);
  for (i = 0; i < NUM_HIGH_BANDS_MAX; ++i) {
    WebRtc_InitBuffer(aec->nearFrBufH[i]);
    WebRtc_InitBuffer(aec->outFrBufH[i]);
  }

  // Initialize far-end buffers.
  WebRtc_InitBuffer(aec->far_time_buf);

#ifdef WEBRTC_AEC_DEBUG_DUMP
  {
    int process_rate = sampFreq > 16000 ? 16000 : sampFreq;
    RTC_AEC_DEBUG_WAV_REOPEN("aec_far", aec->instance_index,
                             aec->debug_dump_count, process_rate,
                             &aec->farFile);
    RTC_AEC_DEBUG_WAV_REOPEN("aec_near", aec->instance_index,
                             aec->debug_dump_count, process_rate,
                             &aec->nearFile);
    RTC_AEC_DEBUG_WAV_REOPEN("aec_out", aec->instance_index,
                             aec->debug_dump_count, process_rate,
                             &aec->outFile);
    RTC_AEC_DEBUG_WAV_REOPEN("aec_out_linear", aec->instance_index,
                             aec->debug_dump_count, process_rate,
                             &aec->outLinearFile);
  }

  RTC_AEC_DEBUG_RAW_OPEN("aec_e_fft", aec->debug_dump_count, &aec->e_fft_file);

  ++aec->debug_dump_count;
#endif
  aec->system_delay = 0;

  if (WebRtc_InitDelayEstimatorFarend(aec->delay_estimator_farend) != 0) {
    return -1;
  }
  if (WebRtc_InitDelayEstimator(aec->delay_estimator) != 0) {
    return -1;
  }
  aec->delay_logging_enabled = 0;
  aec->delay_metrics_delivered = 0;
  memset(aec->delay_histogram, 0, sizeof(aec->delay_histogram));
  aec->num_delay_values = 0;
  aec->delay_median = -1;
  aec->delay_std = -1;
  aec->fraction_poor_delays = -1.0f;

  aec->signal_delay_correction = 0;
  aec->previous_delay = -2;  // (-2): Uninitialized.
  aec->delay_correction_count = 0;
  aec->shift_offset = kInitialShiftOffset;
  aec->delay_quality_threshold = kDelayQualityThresholdMin;

  aec->num_partitions = kNormalNumPartitions;

  // Update the delay estimator with filter length.  We use half the
  // |num_partitions| to take the echo path into account.  In practice we say
  // that the echo has a duration of maximum half |num_partitions|, which is not
  // true, but serves as a crude measure.
  WebRtc_set_allowed_offset(aec->delay_estimator, aec->num_partitions / 2);
  // TODO(bjornv): I currently hard coded the enable.  Once we've established
  // that AECM has no performance regression, robust_validation will be enabled
  // all the time and the APIs to turn it on/off will be removed.  Hence, remove
  // this line then.
  WebRtc_enable_robust_validation(aec->delay_estimator, 1);
  aec->frame_count = 0;

  // Default target suppression mode.
  aec->nlp_mode = 1;

  // Sampling frequency multiplier w.r.t. 8 kHz.
  // In case of multiple bands we process the lower band in 16 kHz, hence the
  // multiplier is always 2.
  if (aec->num_bands > 1) {
    aec->mult = 2;
  } else {
    aec->mult = static_cast<int16_t>(aec->sampFreq) / 8000;
  }

  aec->farBufWritePos = 0;
  aec->farBufReadPos = 0;

  aec->inSamples = 0;
  aec->outSamples = 0;
  aec->knownDelay = 0;

  // Initialize buffers
  memset(aec->dBuf, 0, sizeof(aec->dBuf));
  memset(aec->eBuf, 0, sizeof(aec->eBuf));
  // For H bands
  for (i = 0; i < NUM_HIGH_BANDS_MAX; ++i) {
    memset(aec->dBufH[i], 0, sizeof(aec->dBufH[i]));
  }

  memset(aec->xPow, 0, sizeof(aec->xPow));
  memset(aec->dPow, 0, sizeof(aec->dPow));
  memset(aec->dInitMinPow, 0, sizeof(aec->dInitMinPow));
  aec->noisePow = aec->dInitMinPow;
  aec->noiseEstCtr = 0;

  // Initial comfort noise power
  for (i = 0; i < PART_LEN1; i++) {
    aec->dMinPow[i] = 1.0e6f;
  }

  // Holds the last block written to
  aec->xfBufBlockPos = 0;
  // TODO(peah): Investigate need for these initializations. Deleting them
  // doesn't change the output at all and yields 0.4% overall speedup.
  memset(aec->xfBuf, 0, sizeof(complex_t) * kExtendedNumPartitions * PART_LEN1);
  memset(aec->wfBuf, 0, sizeof(complex_t) * kExtendedNumPartitions * PART_LEN1);
  memset(aec->sde, 0, sizeof(complex_t) * PART_LEN1);
  memset(aec->sxd, 0, sizeof(complex_t) * PART_LEN1);
  memset(aec->xfwBuf, 0,
         sizeof(complex_t) * kExtendedNumPartitions * PART_LEN1);
  memset(aec->se, 0, sizeof(float) * PART_LEN1);

  // To prevent numerical instability in the first block.
  for (i = 0; i < PART_LEN1; i++) {
    aec->sd[i] = 1;
  }
  for (i = 0; i < PART_LEN1; i++) {
    aec->sx[i] = 1;
  }

  memset(aec->hNs, 0, sizeof(aec->hNs));
  memset(aec->outBuf, 0, sizeof(float) * PART_LEN);

  aec->hNlFbMin = 1;
  aec->hNlFbLocalMin = 1;
  aec->hNlXdAvgMin = 1;
  aec->hNlNewMin = 0;
  aec->hNlMinCtr = 0;
  aec->overDrive = 2;
  aec->overDriveSm = 2;
  aec->delayIdx = 0;
  aec->stNearState = 0;
  aec->echoState = 0;
  aec->divergeState = 0;

  aec->seed = 777;
  aec->delayEstCtr = 0;

  aec->extreme_filter_divergence = 0;

  // Metrics disabled by default
  aec->metricsMode = 0;
  InitMetrics(aec);

  return 0;
}